

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportSubroutinePortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSubroutinePortSyntax,slang::syntax::FunctionPrototypeSyntax&>
          (BumpAllocator *this,FunctionPrototypeSyntax *args)

{
  ModportSubroutinePortSyntax *this_00;
  
  this_00 = (ModportSubroutinePortSyntax *)allocate(this,0x18,8);
  slang::syntax::ModportSubroutinePortSyntax::ModportSubroutinePortSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }